

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall
r_exec::CSTController::abduce(CSTController *this,HLPBindingMap *bm,Fact *super_goal)

{
  Code *pCVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  MatchResult MVar5;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  float fVar7;
  _Fact *local_88;
  _Fact *evidence;
  _Fact *bound_pattern;
  _Fact *pattern;
  uint64_t uStack_68;
  uint16_t i;
  uint64_t now;
  Group *host;
  uint16_t obj_count;
  Code *pCStack_50;
  uint16_t obj_set_index;
  Code *cst;
  Sim *sim;
  double confidence;
  _Fact *p_Stack_30;
  bool opposite;
  _Fact *super_goal_target;
  Goal *g;
  Fact *super_goal_local;
  HLPBindingMap *bm_local;
  CSTController *this_local;
  
  g = (Goal *)super_goal;
  super_goal_local = (Fact *)bm;
  bm_local = (HLPBindingMap *)this;
  super_goal_target = (_Fact *)_Fact::get_goal(&super_goal->super__Fact);
  p_Stack_30 = Goal::get_target((Goal *)super_goal_target);
  confidence._7_1_ = _Fact::is_anti_fact(p_Stack_30);
  fVar7 = _Fact::get_cfd(p_Stack_30);
  sim = (Sim *)(double)fVar7;
  cst = (Code *)core::P::operator_cast_to_Sim_((P *)(super_goal_target + 1));
  pCStack_50 = HLPController::get_unpacked_object(&this->super_HLPController);
  (*(pCStack_50->super__Object)._vptr__Object[4])(pCStack_50,2);
  host._6_2_ = r_code::Atom::asIndex();
  (*(pCStack_50->super__Object)._vptr__Object[4])
            (pCStack_50,(ulong)host._6_2_,extraout_RDX,
             CONCAT62((int6)((ulong)in_RCX >> 0x10),host._6_2_));
  bVar2 = r_code::Atom::getAtomCount();
  host._4_2_ = (ushort)bVar2;
  now = (uint64_t)HLPController::get_host(&this->super_HLPController);
  uStack_68 = (*Now)();
  for (pattern._6_2_ = 1; pCVar1 = pCStack_50, pattern._6_2_ <= host._4_2_;
      pattern._6_2_ = pattern._6_2_ + 1) {
    uVar6 = 0;
    (*(pCStack_50->super__Object)._vptr__Object[4])
              (pCStack_50,(ulong)(ushort)(host._6_2_ + pattern._6_2_));
    uVar3 = r_code::Atom::asIndex();
    iVar4 = (*(pCVar1->super__Object)._vptr__Object[9])
                      (pCVar1,(ulong)uVar3,extraout_RDX_00,
                       CONCAT62((int6)((ulong)uVar6 >> 0x10),uVar3));
    bound_pattern = (_Fact *)CONCAT44(extraout_var,iVar4);
    evidence = (_Fact *)HLPBindingMap::bind_pattern
                                  ((HLPBindingMap *)super_goal_local,(Code *)bound_pattern);
    if ((confidence._7_1_ & 1) != 0) {
      _Fact::set_opposite(evidence);
    }
    MVar5 = HLPController::check_evidences(&this->super_HLPController,evidence,&local_88);
    if ((((MVar5 != MATCH_SUCCESS_POSITIVE) && (MVar5 != MATCH_SUCCESS_NEGATIVE)) &&
        (MVar5 == MATCH_FAILURE)) &&
       ((MVar5 = HLPController::check_predicted_evidences
                           (&this->super_HLPController,evidence,&local_88),
        MVar5 != MATCH_SUCCESS_POSITIVE && (MVar5 - MATCH_SUCCESS_NEGATIVE < 2)))) {
      inject_goal(this,(HLPBindingMap *)super_goal_local,(Fact *)g,evidence,(Sim *)cst,uStack_68,
                  (double)sim,(Code *)now);
    }
  }
  return;
}

Assistant:

void CSTController::abduce(HLPBindingMap *bm, Fact *super_goal)   // super_goal is f0->g->f1->icst or f0->g->|f1->icst.
{
    Goal *g = super_goal->get_goal();
    _Fact *super_goal_target = g->get_target();
    bool opposite = (super_goal_target->is_anti_fact());
    double confidence = super_goal_target->get_cfd();
    Sim *sim = g->sim;
    Code *cst = get_unpacked_object();
    uint16_t obj_set_index = cst->code(CST_OBJS).asIndex();
    uint16_t obj_count = cst->code(obj_set_index).getAtomCount();
    Group *host = get_host();
    uint64_t now = Now();

    for (uint16_t i = 1; i <= obj_count; ++i) {
        _Fact *pattern = (_Fact *)cst->get_reference(cst->code(obj_set_index + i).asIndex());
        _Fact *bound_pattern = (_Fact *)bm->bind_pattern(pattern);
        _Fact *evidence;

        if (opposite) {
            bound_pattern->set_opposite();
        }

        switch (check_evidences(bound_pattern, evidence)) {
        case MATCH_SUCCESS_POSITIVE: // positive evidence, no need to produce a sub-goal: skip.
            break;

        case MATCH_SUCCESS_NEGATIVE: // negative evidence, no need to produce a sub-goal, the super-goal will probably fail within the target time frame: skip.
            break;

        case MATCH_FAILURE:
            switch (check_predicted_evidences(bound_pattern, evidence)) {
            case MATCH_SUCCESS_POSITIVE:
                break;

            case MATCH_SUCCESS_NEGATIVE:
            case MATCH_FAILURE: // inject a sub-goal for the missing predicted positive evidence.
                inject_goal(bm, super_goal, bound_pattern, sim, now, confidence, host); // all sub-goals share the same sim.
                break;
            }
        }
    }
}